

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O3

PointAttribute * __thiscall
draco::SequentialAttributeDecoder::GetPortableAttribute(SequentialAttributeDecoder *this)

{
  PointAttribute *pPVar1;
  PointAttribute *pPVar2;
  pointer pIVar3;
  long lVar4;
  pointer pIVar5;
  ulong uVar6;
  
  pPVar1 = this->attribute_;
  if (((pPVar1->identity_mapping_ == false) &&
      (pPVar2 = (this->portable_attribute_)._M_t.
                super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                ._M_t.
                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
      pPVar2 != (PointAttribute *)0x0)) && (pPVar2->identity_mapping_ == true)) {
    pIVar5 = (pPVar1->indices_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pIVar3 = (pPVar1->indices_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2->identity_mapping_ = false;
    std::
    vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ::resize(&(pPVar2->indices_map_).vector_,(long)pIVar5 - (long)pIVar3 >> 2,
             (value_type *)&kInvalidAttributeValueIndex);
    pPVar1 = this->attribute_;
    if ((pPVar1->identity_mapping_ == false) &&
       (pIVar5 = (pPVar1->indices_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       ((long)(pPVar1->indices_map_).vector_.
              super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5 & 0x3fffffffcU) != 0)) {
      lVar4 = *(long *)&(((this->portable_attribute_)._M_t.
                          super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)->
                        indices_map_).vector_.
                        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ;
      uVar6 = 0;
      do {
        *(uint *)(lVar4 + uVar6 * 4) = pIVar5[uVar6].value_;
        uVar6 = uVar6 + 1;
        pIVar5 = (pPVar1->indices_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < ((ulong)((long)(pPVar1->indices_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5) >>
                        2 & 0xffffffff));
    }
  }
  return (this->portable_attribute_)._M_t.
         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
         _M_t.
         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
}

Assistant:

const PointAttribute *SequentialAttributeDecoder::GetPortableAttribute() {
  // If needed, copy point to attribute value index mapping from the final
  // attribute to the portable attribute.
  if (!attribute_->is_mapping_identity() && portable_attribute_ &&
      portable_attribute_->is_mapping_identity()) {
    portable_attribute_->SetExplicitMapping(attribute_->indices_map_size());
    for (PointIndex i(0);
         i < static_cast<uint32_t>(attribute_->indices_map_size()); ++i) {
      portable_attribute_->SetPointMapEntry(i, attribute_->mapped_index(i));
    }
  }
  return portable_attribute_.get();
}